

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O1

ReconciliationRegisterResult __thiscall
TxReconciliationTracker::Impl::RegisterPeer
          (Impl *this,NodeId peer_id,bool is_peer_inbound,uint32_t peer_recon_version,
          uint64_t remote_salt)

{
  variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *__v;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Logger *this_00;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  undefined8 *puVar8;
  CSHA256 *pCVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  TxReconciliationState *__storage;
  ReconciliationRegisterResult RVar13;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  bool is_peer_inbound_local;
  NodeId peer_id_local;
  ulong local_e0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  uint256 full_salt;
  CSHA256 local_a0;
  long local_38;
  
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock13.super_unique_lock._M_owns = false;
  is_peer_inbound_local = is_peer_inbound;
  peer_id_local = peer_id;
  criticalblock13.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&criticalblock13.super_unique_lock);
  uVar1 = (this->m_states)._M_h._M_bucket_count;
  uVar6 = (ulong)peer_id_local % uVar1;
  p_Var10 = (this->m_states)._M_h._M_buckets[uVar6];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var12 = p_Var10->_M_nxt, p_Var11 = p_Var10,
     (_Hash_node_base *)peer_id_local != p_Var10->_M_nxt[1]._M_nxt)) {
    while (p_Var10 = p_Var12, p_Var12 = p_Var10->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var12[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var11 = p_Var10, (_Hash_node_base *)peer_id_local == p_Var12[1]._M_nxt))
      goto LAB_00983e41;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00983e41:
  RVar13 = NOT_FOUND;
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var12 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var12 = p_Var11->_M_nxt;
  }
  if ((p_Var12 != (_Hash_node_base *)0x0) &&
     (RVar13 = ALREADY_REGISTERED, *(char *)&p_Var12[5]._M_nxt != '\x01')) {
    if (this->m_recon_version < peer_recon_version) {
      peer_recon_version = this->m_recon_version;
    }
    if (peer_recon_version == 0) {
      RVar13 = PROTOCOL_VIOLATION;
    }
    else {
      __v = (variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)(p_Var12 + 2);
      uVar1 = *(ulong *)&(__v->
                         super__Variant_base<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                         ).
                         super__Move_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                         .
                         super__Copy_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                         .
                         super__Move_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                         .
                         super__Copy_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                         .
                         super__Variant_storage_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                         ._M_u;
      this_00 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,TXRECONCILIATION,Debug);
      if (bVar4) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
        ;
        source_file._M_len = 0x69;
        logging_function._M_str = "RegisterPeer";
        logging_function._M_len = 0xc;
        LogPrintFormatInternal<long,bool>
                  (logging_function,source_file,0x79,TXRECONCILIATION,Debug,
                   (ConstevalFormatString<2U>)0xfb8fd9,&peer_id_local,&is_peer_inbound_local);
      }
      puVar8 = &(anonymous_namespace)::RECON_SALT_HASHER;
      pCVar9 = &local_a0;
      for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined8 *)pCVar9->s = *puVar8;
        puVar8 = puVar8 + (ulong)bVar7 * -2 + 1;
        pCVar9 = (CSHA256 *)((long)pCVar9 + (ulong)bVar7 * -0x10 + 8);
      }
      local_e0 = uVar1;
      if (remote_salt < uVar1) {
        local_e0 = remote_salt;
      }
      CSHA256::Write(&local_a0,(uchar *)&local_e0,8);
      local_e0 = remote_salt;
      if (remote_salt < uVar1) {
        local_e0 = uVar1;
      }
      CSHA256::Write(&local_a0,(uchar *)&local_e0,8);
      full_salt.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      full_salt.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      CSHA256::Finalize(&local_a0,(uchar *)&full_salt);
      uVar3 = full_salt.super_base_blob<256U>.m_data._M_elems._8_8_;
      uVar2 = full_salt.super_base_blob<256U>.m_data._M_elems._0_8_;
      bVar7 = is_peer_inbound_local ^ 1;
      if (*(char *)&p_Var12[5]._M_nxt == '\x01') {
        std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
        *(byte *)&p_Var12[2]._M_nxt = bVar7;
        p_Var12[3]._M_nxt = (_Hash_node_base *)uVar2;
        p_Var12[4]._M_nxt = (_Hash_node_base *)uVar3;
      }
      else {
        *(byte *)&p_Var12[2]._M_nxt = bVar7;
        p_Var12[3]._M_nxt = (_Hash_node_base *)full_salt.super_base_blob<256U>.m_data._M_elems._0_8_
        ;
        p_Var12[4]._M_nxt = (_Hash_node_base *)full_salt.super_base_blob<256U>.m_data._M_elems._8_8_
        ;
        *(undefined1 *)&p_Var12[5]._M_nxt = 1;
        std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
      }
      RVar13 = SUCCESS;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return RVar13;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);

        if (recon_state == m_states.end()) return ReconciliationRegisterResult::NOT_FOUND;

        if (std::holds_alternative<TxReconciliationState>(recon_state->second)) {
            return ReconciliationRegisterResult::ALREADY_REGISTERED;
        }

        uint64_t local_salt = *std::get_if<uint64_t>(&recon_state->second);

        // If the peer supports the version which is lower than ours, we downgrade to the version
        // it supports. For now, this only guarantees that nodes with future reconciliation
        // versions have the choice of reconciling with this current version. However, they also
        // have the choice to refuse supporting reconciliations if the common version is not
        // satisfactory (e.g. too low).
        const uint32_t recon_version{std::min(peer_recon_version, m_recon_version)};
        // v1 is the lowest version, so suggesting something below must be a protocol violation.
        if (recon_version < 1) return ReconciliationRegisterResult::PROTOCOL_VIOLATION;

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Register peer=%d (inbound=%i)\n",
                      peer_id, is_peer_inbound);

        const uint256 full_salt{ComputeSalt(local_salt, remote_salt)};
        recon_state->second = TxReconciliationState(!is_peer_inbound, full_salt.GetUint64(0), full_salt.GetUint64(1));
        return ReconciliationRegisterResult::SUCCESS;
    }